

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_plexus_archiver_tar.c
# Opt level: O2

void test_compat_plexus_archiver_tar(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  char *v2;
  time_t v2_00;
  la_int64_t lVar4;
  archive_entry *ae;
  char name [36];
  
  builtin_strncpy(name,"test_compat_plexus_archiver_tar.tar",0x24);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
                   ,L'*',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
                      ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  extract_reference_file(name);
  wVar2 = archive_read_open_filename(a,name,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
                      ,L'/',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)",
                      a);
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
                      ,L'2',0,"ARCHIVE_OK",(long)iVar1,"r = archive_read_next_header(a, &ae)",a);
  if (iVar1 == 0) {
    v2 = archive_entry_pathname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
               ,L'8',"commons-logging-1.2/NOTICE.txt","\"commons-logging-1.2/NOTICE.txt\"",v2,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    v2_00 = archive_entry_mtime(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
                        ,L'9',0x53b83fd8,"1404583896",v2_00,"archive_entry_mtime(ae)",(void *)0x0);
    mVar3 = archive_entry_mode(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
                        ,L':',0x81b4,"0100664",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    lVar4 = archive_entry_uid(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
                        ,L';',0,"0",lVar4,"archive_entry_uid(ae)",(void *)0x0);
    lVar4 = archive_entry_gid(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
                        ,L'<',0,"0",lVar4,"archive_entry_gid(ae)",(void *)0x0);
    iVar1 = archive_filter_code((archive *)a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
                        ,L'?',(long)iVar1,"archive_filter_code(a, 0)",0,"ARCHIVE_FILTER_NONE",
                        (void *)0x0);
    iVar1 = archive_format((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
                        ,L'@',(long)iVar1,"archive_format(a)",0x30001,"ARCHIVE_FORMAT_TAR_USTAR",
                        (void *)0x0);
    iVar1 = archive_read_close((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
                        ,L'B',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_plexus_archiver_tar.c"
                        ,L'C',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  else {
    archive_read_free((archive *)a);
  }
  return;
}

Assistant:

DEFINE_TEST(test_compat_plexus_archiver_tar)
{
	char name[] = "test_compat_plexus_archiver_tar.tar";
	struct archive_entry *ae;
	struct archive *a;
	int r;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name,
	    10240));

	/* Read first entry. */
	assertEqualIntA(a, ARCHIVE_OK, r = archive_read_next_header(a, &ae));
	if (r != ARCHIVE_OK) {
		archive_read_free(a);
		return;
	}
	assertEqualString("commons-logging-1.2/NOTICE.txt",
	    archive_entry_pathname(ae));
	assertEqualInt(1404583896, archive_entry_mtime(ae));
	assertEqualInt(0100664, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_uid(ae));
	assertEqualInt(0, archive_entry_gid(ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_NONE);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}